

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcManager.cpp
# Opt level: O0

void __thiscall GrcManager::Clear(GrcManager *this)

{
  long lVar1;
  void *pvVar2;
  value_type pGVar3;
  long lVar4;
  size_type_conflict sVar5;
  reference ppGVar6;
  GdlLangClass *pGVar7;
  reference ppGVar8;
  reference ppGVar9;
  long in_RDI;
  size_t i;
  GrcMasterValueList *in_stack_ffffffffffffff70;
  GdlLangClass *this_00;
  GrcSymbolTable *in_stack_ffffffffffffff80;
  GdlRenderer *in_stack_ffffffffffffffd0;
  GdlLangClass *local_10;
  
  if ((*(long *)(in_RDI + 0x268) != 0) && (lVar1 = *(long *)(in_RDI + 0x268), lVar1 != 0)) {
    in_stack_ffffffffffffffd0 = *(GdlRenderer **)(lVar1 + -8);
    for (lVar4 = lVar1 + (long)in_stack_ffffffffffffffd0 * 0x18; lVar1 != lVar4;
        lVar4 = lVar4 + -0x18) {
      std::vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>::~vector
                ((vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *)
                 in_stack_ffffffffffffff70);
    }
    operator_delete__((void *)(lVar1 + -8),(long)in_stack_ffffffffffffffd0 * 0x18 + 8);
  }
  for (local_10 = (GdlLangClass *)0x0;
      sVar5 = std::vector<GdlExpression_*,_std::allocator<GdlExpression_*>_>::size
                        ((vector<GdlExpression_*,_std::allocator<GdlExpression_*>_> *)
                         (in_RDI + 0x230)), local_10 < sVar5;
      local_10 = (GdlLangClass *)((long)local_10 + 1)) {
    ppGVar6 = std::vector<GdlExpression_*,_std::allocator<GdlExpression_*>_>::operator[]
                        ((vector<GdlExpression_*,_std::allocator<GdlExpression_*>_> *)
                         (in_RDI + 0x230),(size_type_conflict)local_10);
    if (*ppGVar6 != (value_type)0x0) {
      (*(*ppGVar6)->_vptr_GdlExpression[2])();
    }
  }
  std::vector<GdlExpression_*,_std::allocator<GdlExpression_*>_>::clear
            ((vector<GdlExpression_*,_std::allocator<GdlExpression_*>_> *)0x1b78f2);
  if ((*(long *)(in_RDI + 0x208) != 0) &&
     (pvVar2 = *(void **)(in_RDI + 0x208), pvVar2 != (void *)0x0)) {
    GrcGlyphAttrMatrix::~GrcGlyphAttrMatrix((GrcGlyphAttrMatrix *)in_stack_ffffffffffffff80);
    operator_delete(pvVar2,0x20);
  }
  if ((*(long *)(in_RDI + 0x228) != 0) &&
     (pvVar2 = *(void **)(in_RDI + 0x228), pvVar2 != (void *)0x0)) {
    GrcLigComponentList::~GrcLigComponentList((GrcLigComponentList *)in_stack_ffffffffffffff80);
    operator_delete(pvVar2,0x18);
  }
  if ((*(long *)(in_RDI + 0x88) != 0) && (pvVar2 = *(void **)(in_RDI + 0x88), pvVar2 != (void *)0x0)
     ) {
    GdlRenderer::~GdlRenderer(in_stack_ffffffffffffffd0);
    operator_delete(pvVar2,0x118);
  }
  if ((*(long *)(in_RDI + 0x98) != 0) && (pvVar2 = *(void **)(in_RDI + 0x98), pvVar2 != (void *)0x0)
     ) {
    GrcMasterTable::~GrcMasterTable((GrcMasterTable *)in_stack_ffffffffffffff80);
    operator_delete(pvVar2,0x30);
  }
  if ((*(long *)(in_RDI + 0xa0) != 0) && (pvVar2 = *(void **)(in_RDI + 0xa0), pvVar2 != (void *)0x0)
     ) {
    GrcMasterTable::~GrcMasterTable((GrcMasterTable *)in_stack_ffffffffffffff80);
    operator_delete(pvVar2,0x30);
  }
  if ((*(long *)(in_RDI + 0xa8) != 0) &&
     (in_stack_ffffffffffffff80 = *(GrcSymbolTable **)(in_RDI + 0xa8),
     in_stack_ffffffffffffff80 != (GrcSymbolTable *)0x0)) {
    GrcMasterValueList::~GrcMasterValueList(in_stack_ffffffffffffff70);
    operator_delete(in_stack_ffffffffffffff80,0x30);
  }
  if ((*(long *)(in_RDI + 0x90) != 0) && (pvVar2 = *(void **)(in_RDI + 0x90), pvVar2 != (void *)0x0)
     ) {
    GrcSymbolTable::~GrcSymbolTable(in_stack_ffffffffffffff80);
    operator_delete(pvVar2,0x40);
  }
  local_10 = (GdlLangClass *)0x0;
  while (this_00 = local_10,
        pGVar7 = (GdlLangClass *)
                 std::vector<GdlLangClass_*,_std::allocator<GdlLangClass_*>_>::size
                           ((vector<GdlLangClass_*,_std::allocator<GdlLangClass_*>_> *)
                            (in_RDI + 200)), this_00 < pGVar7) {
    ppGVar8 = std::vector<GdlLangClass_*,_std::allocator<GdlLangClass_*>_>::operator[]
                        ((vector<GdlLangClass_*,_std::allocator<GdlLangClass_*>_> *)(in_RDI + 200),
                         (size_type_conflict)local_10);
    pGVar3 = *ppGVar8;
    if (pGVar3 != (value_type)0x0) {
      GdlLangClass::~GdlLangClass(this_00);
      operator_delete(pGVar3,0xc0);
    }
    local_10 = (GdlLangClass *)((long)&(local_10->m_lnf).m_nLinePre + 1);
  }
  std::vector<GdlLangClass_*,_std::allocator<GdlLangClass_*>_>::clear
            ((vector<GdlLangClass_*,_std::allocator<GdlLangClass_*>_> *)0x1b7b8f);
  for (local_10 = (GdlLangClass *)0x0;
      sVar5 = std::vector<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_>::size
                        ((vector<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_> *)
                         (in_RDI + 0x278)), local_10 < sVar5;
      local_10 = (GdlLangClass *)((long)local_10 + 1)) {
    ppGVar9 = std::vector<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_>::operator[]
                        ((vector<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_> *)
                         (in_RDI + 0x278),(size_type_conflict)local_10);
    if (*ppGVar9 != (value_type)0x0) {
      (*((*ppGVar9)->super_GdlDefn)._vptr_GdlDefn[1])();
    }
  }
  return;
}

Assistant:

void GrcManager::Clear()
{
	if (m_prgvpglfcFsmClasses)
		delete[] m_prgvpglfcFsmClasses;

	size_t i;
	for (i = 0; i < m_vpexpModified.size(); ++i)
		delete m_vpexpModified[i];
	m_vpexpModified.clear();

	if (m_pgax)
		delete m_pgax;
	if (m_plclist)
		delete m_plclist;

	if (m_prndr)
		delete m_prndr;

	if (m_mtbGlyphAttrs)
		delete m_mtbGlyphAttrs;
	if (m_mtbFeatures)
		delete m_mtbFeatures;
	if (m_mvlNameStrings)
		delete m_mvlNameStrings;

	if (m_psymtbl)
		delete m_psymtbl;

	for (i = 0; i < this->m_vplcls.size(); i++)
		delete m_vplcls[i];
	m_vplcls.clear();

	for (i = 0; i < m_vpfeatInput.size(); ++i)
		delete m_vpfeatInput[i];
}